

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

SVGLinearGradientAttributes * __thiscall
lunasvg::SVGLinearGradientElement::collectGradientAttributes
          (SVGLinearGradientAttributes *__return_storage_ptr__,SVGLinearGradientElement *this)

{
  _Rb_tree_header *p_Var1;
  ElementID EVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  SVGLinearGradientElement *pSVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  SVGLinearGradientElement *element;
  SVGGradientElement *current;
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  processedGradients;
  SVGLinearGradientElement *local_68;
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  local_60;
  
  __return_storage_ptr__->m_x2 = (SVGLinearGradientElement *)0x0;
  __return_storage_ptr__->m_y2 = (SVGLinearGradientElement *)0x0;
  __return_storage_ptr__->m_x1 = (SVGLinearGradientElement *)0x0;
  __return_storage_ptr__->m_y1 = (SVGLinearGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientUnits = (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientContentElement =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientTransform =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_spreadMethod = (SVGGradientElement *)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    SVGGradientElement::collectGradientAttributes
              (&local_68->super_SVGGradientElement,
               &__return_storage_ptr__->super_SVGGradientAttributes);
    pSVar5 = local_68;
    if ((local_68->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.m_id ==
        LinearGradient) {
      if ((__return_storage_ptr__->m_x1 == (SVGLinearGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)local_68,X1), bVar4)) {
        __return_storage_ptr__->m_x1 = pSVar5;
      }
      if ((__return_storage_ptr__->m_y1 == (SVGLinearGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)pSVar5,Y1), bVar4)) {
        __return_storage_ptr__->m_y1 = pSVar5;
      }
      if ((__return_storage_ptr__->m_x2 == (SVGLinearGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)pSVar5,X2), bVar4)) {
        __return_storage_ptr__->m_x2 = pSVar5;
      }
      if ((__return_storage_ptr__->m_y2 == (SVGLinearGradientElement *)0x0) &&
         (bVar4 = SVGElement::hasAttribute((SVGElement *)pSVar5,Y2), bVar4)) {
        __return_storage_ptr__->m_y2 = pSVar5;
      }
    }
    pSVar5 = (SVGLinearGradientElement *)
             SVGURIReference::getTargetElement
                       (&(local_68->super_SVGGradientElement).super_SVGURIReference,
                        (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.
                        super_SVGNode.m_document);
    if ((pSVar5 == (SVGLinearGradientElement *)0x0) ||
       ((EVar2 = (pSVar5->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.m_id,
        EVar2 != LinearGradient && (EVar2 != RadialGradient)))) break;
    std::
    _Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
    ::_M_insert_unique<lunasvg::SVGGradientElement_const*const&>
              ((_Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
                *)&local_60,(SVGGradientElement **)&local_68);
    p_Var6 = &p_Var1->_M_header;
    for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(SVGLinearGradientElement **)(p_Var3 + 1) < pSVar5]) {
      if (*(SVGLinearGradientElement **)(p_Var3 + 1) >= pSVar5) {
        p_Var6 = p_Var3;
      }
    }
    p_Var7 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = (_Rb_tree_header *)p_Var6,
       pSVar5 < (SVGLinearGradientElement *)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var7 = p_Var1;
    }
    local_68 = pSVar5;
  } while (p_Var7 == p_Var1);
  SVGLinearGradientAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

SVGLinearGradientAttributes SVGLinearGradientElement::collectGradientAttributes() const
{
    SVGLinearGradientAttributes attributes;
    std::set<const SVGGradientElement*> processedGradients;
    const SVGGradientElement* current = this;
    while(true) {
        current->collectGradientAttributes(attributes);
        if(current->id() == ElementID::LinearGradient) {
            auto element = static_cast<const SVGLinearGradientElement*>(current);
            if(!attributes.hasX1() && element->hasAttribute(PropertyID::X1))
                attributes.setX1(element);
            if(!attributes.hasY1() && element->hasAttribute(PropertyID::Y1))
                attributes.setY1(element);
            if(!attributes.hasX2() && element->hasAttribute(PropertyID::X2))
                attributes.setX2(element);
            if(!attributes.hasY2() && element->hasAttribute(PropertyID::Y2)) {
                attributes.setY2(element);
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || !(targetElement->id() == ElementID::LinearGradient || targetElement->id() == ElementID::RadialGradient))
            break;
        processedGradients.insert(current);
        current = static_cast<const SVGGradientElement*>(targetElement);
        if(processedGradients.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}